

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::utility::operator>>
          (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,io_range<unsigned_int_*> *IO_range
          )

{
  bool bVar1;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_RSI;
  wistream *in_RDI;
  bool bVar2;
  uint *pos;
  char *in_stack_ffffffffffffffc8;
  delim_str *d;
  
  d = *(delim_str **)in_RSI;
  while( true ) {
    bVar1 = std::wios::operator_cast_to_bool((wios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
    bVar2 = false;
    if (bVar1) {
      bVar2 = d != *(delim_str **)(in_RSI + 8);
    }
    if (!bVar2) break;
    std::wistream::operator>>(in_RDI,(uint *)d);
    d = (delim_str *)((long)&d->str + 4);
    if (d != *(delim_str **)(in_RSI + 8)) {
      delim(in_stack_ffffffffffffffc8);
      operator>>(in_RSI,d);
    }
  }
  return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)in_RDI;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                     const io_range<T> &IO_range) {
      T pos{IO_range.first};
      while (in and pos != IO_range.last) {
        in >> (*pos);
        ++pos;
        if (pos != IO_range.last)
          in >> delim(IO_range.delim_str);
      }
      return in;
    }